

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calibrateGyro.cpp
# Opt level: O1

void __thiscall
CalibrateGyro::CalibrateGyro
          (CalibrateGyro *this,string *OutputFile_Kinematic,string *OutputFile_Static)

{
  long lVar1;
  pointer __ptr;
  long lVar2;
  VecVector3d local_98;
  CalibrateGyro *local_78;
  string local_70;
  string local_50;
  
  memset(this,0,0x90);
  memset(this->Gyro_Static,0,0x90);
  local_98.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar2 = 8;
  local_78 = this;
  do {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    lVar1 = *(long *)((long)OutputFile_Kinematic + lVar2 + -8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,lVar1,
               *(long *)((long)&(OutputFile_Kinematic->_M_dataplus)._M_p + lVar2) + lVar1);
    ReadASC(&local_70,&local_98,this->Gyro_Kinematic);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    lVar1 = *(long *)((long)OutputFile_Static + lVar2 + -8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,lVar1,
               *(long *)((long)&(OutputFile_Static->_M_dataplus)._M_p + lVar2) + lVar1);
    ReadASC(&local_50,&local_98,this->Gyro_Static);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    __ptr = local_98.
            super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    local_98.
    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.
    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.
    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (__ptr != (pointer)0x0) {
      free(__ptr);
    }
    this = (CalibrateGyro *)
           (&this->Gyro_Kinematic[0].
             super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           + 1);
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 200);
  if (local_98.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free(local_98.
         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

CalibrateGyro::CalibrateGyro(string* OutputFile_Kinematic, string* OutputFile_Static)
{
    VecVector3d accel_temp;
    for(int i = 0; i < 6; ++i)
    {
        try
        {
            ReadASC(OutputFile_Kinematic[i], accel_temp, this->Gyro_Kinematic[i]);
            ReadASC(OutputFile_Static[i], accel_temp, this->Gyro_Static[i]);
        }
        catch(...)
        {
            cout << "数组越界，请检查！" << endl;
        }
        vector<Vector3d, Eigen::aligned_allocator<Vector3d>>().swap(accel_temp);
    }
}